

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctflt.c
# Opt level: O2

void jpeg_idct_float(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  void *pvVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  ushort uVar7;
  float fVar8;
  float fVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float afStack_128 [64];
  
  auVar4 = _DAT_0017b7d0;
  pJVar1 = cinfo->sample_range_limit;
  pvVar2 = compptr->dct_table;
  lVar5 = 0;
  do {
    if ((int)lVar5 == 8) {
      uVar3 = (ulong)output_col;
      for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
        fVar13 = afStack_128[lVar5] + 128.5 + afStack_128[lVar5 + 4];
        fVar8 = (afStack_128[lVar5] + 128.5) - afStack_128[lVar5 + 4];
        fVar15 = afStack_128[lVar5 + 2] + afStack_128[lVar5 + 6];
        fVar17 = fVar13 + fVar15;
        fVar18 = afStack_128[lVar5 + 5] + afStack_128[lVar5 + 3];
        fVar16 = afStack_128[lVar5 + 5] - afStack_128[lVar5 + 3];
        fVar12 = afStack_128[lVar5 + 1] + afStack_128[lVar5 + 7];
        fVar11 = afStack_128[lVar5 + 1] - afStack_128[lVar5 + 7];
        fVar21 = fVar18 + fVar12;
        fVar19 = (fVar16 + fVar11) * 1.847759;
        fVar14 = (afStack_128[lVar5 + 2] - afStack_128[lVar5 + 6]) * 1.4142135 - fVar15;
        fVar16 = (fVar16 * -2.613126 + fVar19) - fVar21;
        fVar20 = fVar8 + fVar14;
        fVar13 = fVar13 - fVar15;
        fVar8 = fVar8 - fVar14;
        fVar12 = (fVar12 - fVar18) * 1.4142135 - fVar16;
        fVar11 = (fVar11 * -1.0823922 + fVar19) - fVar12;
        auVar9._0_4_ = (int)(fVar12 + fVar8);
        auVar9._4_4_ = (int)(fVar8 - fVar12);
        auVar9._8_4_ = (int)(fVar11 + fVar13);
        auVar9._12_4_ = (int)(fVar13 - fVar11);
        auVar9 = pshuflw(auVar9,auVar9,0xe8);
        auVar9 = pshufhw(auVar9,auVar9,0xe8);
        auVar10._0_4_ = auVar9._0_4_;
        auVar10._8_4_ = auVar9._8_4_;
        auVar10._12_4_ = auVar9._12_4_;
        auVar10._4_4_ = auVar10._8_4_;
        auVar10 = auVar10 & auVar4;
        lVar6 = *(long *)((long)output_buf + lVar5);
        *(JSAMPLE *)(lVar6 + uVar3) = pJVar1[(int)(fVar17 + fVar21) & 0x3ff];
        *(JSAMPLE *)(lVar6 + 7 + uVar3) = pJVar1[(int)(fVar17 - fVar21) & 0x3ff];
        *(JSAMPLE *)(lVar6 + 1 + uVar3) = pJVar1[(int)(fVar20 + fVar16) & 0x3ff];
        *(JSAMPLE *)(lVar6 + 6 + uVar3) = pJVar1[(int)(fVar20 - fVar16) & 0x3ff];
        *(JSAMPLE *)(lVar6 + 2 + uVar3) = pJVar1[auVar10._0_2_];
        *(JSAMPLE *)(lVar6 + 5 + uVar3) = pJVar1[auVar10._2_2_];
        *(JSAMPLE *)(lVar6 + 3 + uVar3) = pJVar1[auVar10._4_2_];
        *(JSAMPLE *)(lVar6 + 4 + uVar3) = pJVar1[auVar10._6_2_];
      }
      return;
    }
    uVar7 = coef_block[lVar5 + 0x10];
    if (uVar7 == 0 && coef_block[lVar5 + 8] == 0) {
      if ((((coef_block[lVar5 + 0x18] != 0) || (coef_block[lVar5 + 0x20] != 0)) ||
          (coef_block[lVar5 + 0x28] != 0)) ||
         ((coef_block[lVar5 + 0x30] != 0 || (coef_block[lVar5 + 0x38] != 0)))) {
        uVar7 = 0;
        goto LAB_0013f3e5;
      }
      fVar8 = *(float *)((long)pvVar2 + lVar5 * 4) * 0.125 * (float)(int)coef_block[lVar5];
      afStack_128[lVar5] = fVar8;
      afStack_128[lVar5 + 8] = fVar8;
      afStack_128[lVar5 + 0x10] = fVar8;
      afStack_128[lVar5 + 0x18] = fVar8;
      afStack_128[lVar5 + 0x20] = fVar8;
      afStack_128[lVar5 + 0x28] = fVar8;
      afStack_128[lVar5 + 0x30] = fVar8;
      lVar6 = 0xe0;
    }
    else {
LAB_0013f3e5:
      fVar13 = *(float *)((long)pvVar2 + lVar5 * 4) * 0.125 * (float)(int)coef_block[lVar5];
      fVar14 = *(float *)((long)pvVar2 + lVar5 * 4 + 0x40) * 0.125 *
               (float)(int)((long)((ulong)uVar7 << 0x30) >> 0x30);
      fVar8 = *(float *)((long)pvVar2 + lVar5 * 4 + 0x80) * 0.125 *
              (float)(int)coef_block[lVar5 + 0x20];
      fVar11 = *(float *)((long)pvVar2 + lVar5 * 4 + 0xc0) * 0.125 *
               (float)(int)((long)((ulong)(ushort)coef_block[lVar5 + 0x30] << 0x30) >> 0x30);
      fVar12 = fVar13 - fVar8;
      fVar8 = fVar8 + fVar13;
      fVar13 = fVar11 + fVar14;
      fVar11 = (fVar14 - fVar11) * 1.4142135 - fVar13;
      fVar15 = fVar8 + fVar13;
      fVar8 = fVar8 - fVar13;
      fVar14 = fVar12 + fVar11;
      fVar12 = fVar12 - fVar11;
      fVar16 = *(float *)((long)pvVar2 + lVar5 * 4 + 0xa0) * 0.125 *
               (float)(int)coef_block[lVar5 + 0x28];
      fVar17 = *(float *)((long)pvVar2 + lVar5 * 4 + 0x60) * 0.125 *
               (float)(int)((long)((ulong)(ushort)coef_block[lVar5 + 0x18] << 0x30) >> 0x30);
      fVar11 = *(float *)((long)pvVar2 + lVar5 * 4 + 0x20) * 0.125 *
               (float)(int)coef_block[lVar5 + 8];
      fVar13 = *(float *)((long)pvVar2 + lVar5 * 4 + 0xe0) * 0.125 *
               (float)(int)((long)((ulong)(ushort)coef_block[lVar5 + 0x38] << 0x30) >> 0x30);
      fVar18 = fVar17 + fVar16;
      fVar16 = fVar16 - fVar17;
      fVar17 = fVar11 + fVar13;
      fVar11 = fVar11 - fVar13;
      fVar20 = fVar18 + fVar17;
      fVar19 = (fVar16 + fVar11) * 1.847759;
      fVar13 = (fVar16 * -2.613126 + fVar19) - fVar20;
      fVar16 = (fVar17 - fVar18) * 1.4142135 - fVar13;
      fVar11 = (fVar11 * -1.0823922 + fVar19) - fVar16;
      afStack_128[lVar5] = fVar15 + fVar20;
      afStack_128[lVar5 + 0x38] = fVar15 - fVar20;
      afStack_128[lVar5 + 8] = fVar14 + fVar13;
      afStack_128[lVar5 + 0x30] = fVar14 - fVar13;
      afStack_128[lVar5 + 0x10] = fVar12 + fVar16;
      afStack_128[lVar5 + 0x28] = fVar12 - fVar16;
      afStack_128[lVar5 + 0x18] = fVar8 + fVar11;
      fVar8 = fVar8 - fVar11;
      lVar6 = 0x80;
    }
    *(float *)((long)afStack_128 + lVar5 * 4 + lVar6) = fVar8;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_float(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  FLOAT_MULT_TYPE *quantptr;
  FAST_FLOAT *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  int ctr;
  FAST_FLOAT workspace[DCTSIZE2]; /* buffers data between passes */
#define _0_125  ((FLOAT_MULT_TYPE)0.125)

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (FLOAT_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      FAST_FLOAT dcval = DEQUANTIZE(inptr[DCTSIZE * 0],
                                    quantptr[DCTSIZE * 0] * _0_125);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0] * _0_125);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2] * _0_125);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4] * _0_125);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6] * _0_125);

    tmp10 = tmp0 + tmp2;        /* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;        /* phases 5-3 */
    tmp12 = (tmp1 - tmp3) * ((FAST_FLOAT)1.414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;       /* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1] * _0_125);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3] * _0_125);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5] * _0_125);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7] * _0_125);

    z13 = tmp6 + tmp5;          /* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = (z11 - z13) * ((FAST_FLOAT)1.414213562); /* 2*c4 */

    z5 = (z10 + z12) * ((FAST_FLOAT)1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT)1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT)2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    wsptr[DCTSIZE * 0] = tmp0 + tmp7;
    wsptr[DCTSIZE * 7] = tmp0 - tmp7;
    wsptr[DCTSIZE * 1] = tmp1 + tmp6;
    wsptr[DCTSIZE * 6] = tmp1 - tmp6;
    wsptr[DCTSIZE * 2] = tmp2 + tmp5;
    wsptr[DCTSIZE * 5] = tmp2 - tmp5;
    wsptr[DCTSIZE * 3] = tmp3 + tmp4;
    wsptr[DCTSIZE * 4] = tmp3 - tmp4;

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * And testing floats for zero is relatively expensive, so we don't bother.
     */

    /* Even part */

    /* Apply signed->unsigned and prepare float->int conversion */
    z5 = wsptr[0] + ((FAST_FLOAT)CENTERJSAMPLE + (FAST_FLOAT)0.5);
    tmp10 = z5 + wsptr[4];
    tmp11 = z5 - wsptr[4];

    tmp13 = wsptr[2] + wsptr[6];
    tmp12 = (wsptr[2] - wsptr[6]) * ((FAST_FLOAT)1.414213562) - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = wsptr[5] + wsptr[3];
    z10 = wsptr[5] - wsptr[3];
    z11 = wsptr[1] + wsptr[7];
    z12 = wsptr[1] - wsptr[7];

    tmp7 = z11 + z13;
    tmp11 = (z11 - z13) * ((FAST_FLOAT)1.414213562);

    z5 = (z10 + z12) * ((FAST_FLOAT)1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT)1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT)2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    /* Final output stage: float->int conversion and range-limit */

    outptr[0] = range_limit[((int)(tmp0 + tmp7)) & RANGE_MASK];
    outptr[7] = range_limit[((int)(tmp0 - tmp7)) & RANGE_MASK];
    outptr[1] = range_limit[((int)(tmp1 + tmp6)) & RANGE_MASK];
    outptr[6] = range_limit[((int)(tmp1 - tmp6)) & RANGE_MASK];
    outptr[2] = range_limit[((int)(tmp2 + tmp5)) & RANGE_MASK];
    outptr[5] = range_limit[((int)(tmp2 - tmp5)) & RANGE_MASK];
    outptr[3] = range_limit[((int)(tmp3 + tmp4)) & RANGE_MASK];
    outptr[4] = range_limit[((int)(tmp3 - tmp4)) & RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}